

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O3

bool __thiscall
MipsParser::parseRspVectorElement(MipsParser *this,Parser *parser,MipsRegisterValue *dest)

{
  long *plVar1;
  TokenType TVar2;
  pointer pcVar3;
  char *__s;
  long *plVar4;
  bool bVar5;
  int iVar6;
  Token *pTVar7;
  long lVar8;
  MipsParser *this_00;
  long *plVar9;
  string stringValue;
  allocator<char> local_91;
  long *local_90;
  long local_88;
  long local_80 [2];
  string local_70;
  Identifier local_50;
  
  dest->type = RspVectorElement;
  pTVar7 = Tokenizer::peekToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  if (pTVar7->type != LBrack) {
    dest->num = 0;
    local_80[0] = 0;
    local_80[1] = 0;
    local_88 = 0;
    local_90 = local_80;
    std::__cxx11::string::operator=((string *)&dest->name,(string *)&local_90);
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    return true;
  }
  this_00 = (MipsParser *)
            (parser->entries).
            super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].tokenizer;
  Tokenizer::eatTokens((Tokenizer *)this_00,1);
  bVar5 = parseRegisterNumber(this_00,parser,dest,0x10);
  pTVar7 = Tokenizer::nextToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
  TVar2 = pTVar7->type;
  if (bVar5) {
    return TVar2 == RBrack;
  }
  if ((TVar2 != NumberString) && (TVar2 != Integer)) {
    return false;
  }
  local_90 = local_80;
  pcVar3 = (pTVar7->originalText)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar3,pcVar3 + (pTVar7->originalText)._M_string_length);
  plVar1 = (long *)((long)local_90 + local_88);
  plVar9 = local_90;
  if (0 < local_88 >> 2) {
    lVar8 = (local_88 >> 2) + 1;
    plVar4 = (long *)((long)local_90 + 3);
    do {
      plVar9 = plVar4;
      iVar6 = iswupper((int)*(char *)((long)plVar9 + -3));
      if (iVar6 != 0) {
        plVar9 = (long *)((long)plVar9 + -3);
        goto LAB_00166dda;
      }
      iVar6 = iswupper((int)*(char *)((long)plVar9 + -2));
      if (iVar6 != 0) {
        plVar9 = (long *)((long)plVar9 + -2);
        goto LAB_00166dda;
      }
      iVar6 = iswupper((int)*(char *)((long)plVar9 + -1));
      if (iVar6 != 0) {
        plVar9 = (long *)((long)plVar9 + -1);
        goto LAB_00166dda;
      }
      iVar6 = iswupper((int)(char)*plVar9);
      if (iVar6 != 0) goto LAB_00166dda;
      lVar8 = lVar8 + -1;
      plVar4 = (long *)((long)plVar9 + 4);
    } while (1 < lVar8);
    plVar9 = (long *)((long)plVar9 + 1);
  }
  lVar8 = (long)plVar1 - (long)plVar9;
  if (lVar8 == 1) {
LAB_00166db2:
    iVar6 = iswupper((int)(char)*plVar9);
    if (iVar6 == 0) {
      plVar9 = plVar1;
    }
  }
  else if (lVar8 == 2) {
LAB_00166da1:
    iVar6 = iswupper((int)(char)*plVar9);
    if (iVar6 == 0) {
      plVar9 = (long *)((long)plVar9 + 1);
      goto LAB_00166db2;
    }
  }
  else {
    if (lVar8 != 3) goto LAB_00166e07;
    iVar6 = iswupper((int)(char)*plVar9);
    if (iVar6 == 0) {
      plVar9 = (long *)((long)plVar9 + 1);
      goto LAB_00166da1;
    }
  }
LAB_00166dda:
  plVar4 = local_90;
  if ((plVar9 != plVar1) && (local_88 != 0)) {
    lVar8 = 0;
    do {
      iVar6 = tolower((int)*(char *)((long)plVar4 + lVar8));
      *(char *)((long)plVar4 + lVar8) = (char)iVar6;
      lVar8 = lVar8 + 1;
    } while (local_88 != lVar8);
  }
LAB_00166e07:
  lVar8 = 8;
  do {
    __s = *(char **)((long)&mipsRspVectorRegisters[0x29].num + lVar8);
    iVar6 = std::__cxx11::string::compare((char *)&local_90);
    if (iVar6 == 0) {
      dest->num = *(int *)((long)&parseRspVectorElement::rspElementNames[0].name + lVar8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_91);
      Identifier::Identifier(&local_50,&local_70);
      std::__cxx11::string::operator=((string *)&dest->name,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._name._M_dataplus._M_p != &local_50._name.field_2) {
        operator_delete(local_50._name._M_dataplus._M_p,
                        local_50._name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pTVar7 = Tokenizer::nextToken
                         ((parser->entries).
                          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
      bVar5 = pTVar7->type == RBrack;
      goto LAB_00166ec7;
    }
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x168);
  bVar5 = false;
LAB_00166ec7:
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  return bVar5;
}

Assistant:

bool MipsParser::parseRspVectorElement(Parser& parser, MipsRegisterValue& dest)
{
	dest.type = MipsRegisterType::RspVectorElement;

	if (parser.peekToken().type == TokenType::LBrack)
	{
		static const MipsRegisterDescriptor rspElementNames[] = {
			{ "0q", 2 },  { "1q", 3 }, { "0h", 4 },  { "1h", 5 },
			{ "2h", 6 },  { "3h", 7 }, { "0w", 8 },  { "0", 8 },
			{ "1w", 9 },  { "1", 9 },  { "2w", 10 }, { "2", 10 },
			{ "3w", 11 }, { "3", 11 }, { "4w", 12 }, { "4", 12 },
			{ "5w", 13 }, { "5", 13 }, { "6w", 14 }, { "6", 14 },
			{ "7w", 15 }, { "7", 15 },
		};

		parser.eatToken();

		if (parseRegisterNumber(parser, dest, 16))
			return parser.nextToken().type == TokenType::RBrack;

		const Token& token = parser.nextToken();

		if (token.type != TokenType::Integer && token.type != TokenType::NumberString)
			return false;

		//ignore the numerical values, just use the original text as an identifier
		std::string stringValue = token.getOriginalText();
		if (std::any_of(stringValue.begin(), stringValue.end(), iswupper))
		{
			std::transform(stringValue.begin(), stringValue.end(), stringValue.begin(), tolower);
		}

		for (size_t i = 0; i < std::size(rspElementNames); i++)
		{
			if (stringValue == rspElementNames[i].name)
			{
				dest.num = rspElementNames[i].num;
				dest.name = Identifier(rspElementNames[i].name);

				return parser.nextToken().type == TokenType::RBrack;
			}
		}

		return false;
	}

	dest.num = 0;
	dest.name = Identifier();

	return true;

}